

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_utils.h
# Opt level: O2

void set_size_independent_vars(AV1_COMP *cpi)

{
  int32_t *piVar1;
  long lVar2;
  
  for (lVar2 = 0x41f08; lVar2 != 0x42004; lVar2 = lVar2 + 0x24) {
    piVar1 = (int32_t *)((long)(cpi->enc_quant_dequant_params).quants.y_quant[0] + lVar2);
    piVar1[0] = 0;
    piVar1[1] = 0x10000;
    *(undefined8 *)(piVar1 + 2) = 0;
    piVar1 = (int32_t *)((long)((cpi->enc_quant_dequant_params).quants.y_quant + -1) + lVar2);
    piVar1[0] = 0;
    piVar1[1] = 0;
    piVar1[2] = 0x10000;
    piVar1[3] = 0;
    *(undefined4 *)((long)(cpi->enc_quant_dequant_params).quants.y_quant[1] + lVar2) = 0;
  }
  (cpi->gm_info).search_done = false;
  av1_set_speed_features_framesize_independent(cpi,cpi->speed);
  av1_set_rd_speed_thresholds(cpi);
  (cpi->common).features.interp_filter = MULTITAP_SHARP2;
  (cpi->common).features.switchable_motion_mode =
       (_Bool)((cpi->oxcf).motion_mode_cfg.enable_obmc | (cpi->common).features.allow_warped_motion)
  ;
  return;
}

Assistant:

static inline void set_size_independent_vars(AV1_COMP *cpi) {
  int i;
  AV1_COMMON *const cm = &cpi->common;
  FeatureFlags *const features = &cm->features;
  for (i = LAST_FRAME; i <= ALTREF_FRAME; ++i) {
    cm->global_motion[i] = default_warp_params;
  }
  cpi->gm_info.search_done = 0;

  av1_set_speed_features_framesize_independent(cpi, cpi->speed);
  av1_set_rd_speed_thresholds(cpi);
  features->interp_filter = SWITCHABLE;
  features->switchable_motion_mode = is_switchable_motion_mode_allowed(
      features->allow_warped_motion, cpi->oxcf.motion_mode_cfg.enable_obmc);
}